

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

bool __thiscall xLearn::Model::Deserialize(Model *this,string *filename)

{
  FILE *file_ptr;
  ostream *poVar1;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (filename->_M_string_length != 0) {
    file_ptr = OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    if (file_ptr != (FILE *)0x0) {
      ReadStringFromFile(file_ptr,&this->score_func_);
      ReadStringFromFile(file_ptr,&this->loss_func_);
      ReadDataFromDisk(file_ptr,(char *)&this->num_feat_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->num_field_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->num_K_,4);
      ReadDataFromDisk(file_ptr,(char *)&this->aux_size_,4);
      deserialize_w_v_b(this,file_ptr);
      Close(file_ptr);
    }
    return file_ptr != (FILE *)0x0;
  }
  local_64.severity_ = ERR;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,"");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Deserialize","");
  poVar1 = Logger::Start(ERR,&local_40,300,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,300);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"filename.empty()",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

bool Model::Deserialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename.c_str(), "rb");
#endif
  if (file == NULL) { return false; }
  // Read score function
  ReadStringFromFile(file, score_func_);
  // Read loss function
  ReadStringFromFile(file, loss_func_);
  // Read feature num
  ReadDataFromDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Read field num
  ReadDataFromDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Read K
  ReadDataFromDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Read aux_size
  ReadDataFromDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Read w
  this->deserialize_w_v_b(file);
  Close(file);
  return true;
}